

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

size_t __thiscall v_array<node_pred>::find_sorted(v_array<node_pred> *this,node_pred *ele)

{
  uint uVar1;
  node_pred *pnVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  pnVar2 = this->_begin;
  uVar3 = ((long)this->_end - (long)pnVar2) / 0x18;
  uVar1 = ele->label;
  sVar5 = uVar3;
  sVar6 = 0;
  while( true ) {
    if (uVar3 - sVar6 < 2) {
      sVar5 = sVar6;
      if (((this->_end != pnVar2) && (pnVar2[sVar6].label <= uVar1)) &&
         (sVar5 = uVar3, pnVar2[sVar6].label == uVar1)) {
        sVar5 = sVar6;
      }
      return sVar5;
    }
    uVar4 = sVar5 >> 1;
    sVar7 = uVar4;
    if ((uVar1 <= pnVar2[uVar4].label) &&
       (uVar3 = uVar4, sVar7 = sVar6, pnVar2[uVar4].label <= uVar1)) break;
    sVar5 = uVar3 + sVar7;
    sVar6 = sVar7;
  }
  return uVar4;
}

Assistant:

size_t find_sorted(const T& ele) const  // index of the smallest element >= ele, return true if element is in the
                                          // array
  {
    size_t size = _end - _begin;
    size_t a = 0;
    size_t b = size;
    size_t i = (a + b) / 2;

    while (b - a > 1)
    {
      if (_begin[i] < ele)  // if a = 0, size = 1, if in while we have b - a >= 1 the loop is infinite
        a = i;
      else if (_begin[i] > ele)
        b = i;
      else
        return i;

      i = (a + b) / 2;
    }

    if ((size == 0) || (_begin[a] > ele) || (_begin[a] == ele))  // pusta tablica, nie wchodzi w while
      return a;
    else  // size = 1, ele = 1, _begin[0] = 0
      return b;
  }